

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::LowerCoerseRegex(Lowerer *this,Instr *instr)

{
  bool bVar1;
  LabelInstr *labelTarget;
  LabelInstr *target;
  Opnd *pOVar2;
  RegOpnd *baseOpnd;
  IndirOpnd *compareSrc1;
  AddrOpnd *opndArg;
  Opnd *vtableOpnd;
  RegOpnd *src1Opnd;
  LabelInstr *doneLabel;
  LabelInstr *helperLabel;
  Instr *instr_local;
  Lowerer *this_local;
  
  labelTarget = IR::LabelInstr::New(Label,this->m_func,true);
  target = IR::LabelInstr::New(Label,this->m_func,false);
  pOVar2 = IR::Instr::UnlinkSrc1(instr);
  baseOpnd = IR::Opnd::AsRegOpnd(pOVar2);
  bVar1 = IR::Opnd::IsNotTaggedValue(&baseOpnd->super_Opnd);
  if (!bVar1) {
    LowererMD::GenerateObjectTest(&this->m_lowererMD,&baseOpnd->super_Opnd,instr,labelTarget,false);
  }
  pOVar2 = LoadVTableValueOpnd(this,instr,VtableJavascriptRegExp);
  compareSrc1 = IR::IndirOpnd::New(baseOpnd,0,TyUint64,instr->m_func,false);
  InsertCompareBranch(this,&compareSrc1->super_Opnd,pOVar2,BrNeq_A,labelTarget,instr,false);
  pOVar2 = IR::Instr::GetDst(instr);
  InsertMove(pOVar2,&baseOpnd->super_Opnd,instr,true);
  InsertBranch(Br,target,instr);
  IR::Instr::InsertBefore(instr,&labelTarget->super_Instr);
  IR::Instr::InsertAfter(instr,&target->super_Instr);
  LoadScriptContext(this,instr);
  opndArg = IR::AddrOpnd::NewNull(instr->m_func);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,&opndArg->super_Opnd);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,&baseOpnd->super_Opnd);
  LowererMD::ChangeToHelperCall
            (&this->m_lowererMD,instr,HelperOp_CoerseRegex,(LabelInstr *)0x0,(Opnd *)0x0,
             (PropertySymOpnd *)0x0,false);
  return;
}

Assistant:

void
Lowerer::LowerCoerseRegex(IR::Instr* instr)
{
    IR::LabelInstr * helperLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
    IR::LabelInstr * doneLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func);
    IR::RegOpnd * src1Opnd = instr->UnlinkSrc1()->AsRegOpnd();
    if (!src1Opnd->IsNotTaggedValue())
    {
        this->m_lowererMD.GenerateObjectTest(src1Opnd, instr, helperLabel);
    }

    IR::Opnd * vtableOpnd = LoadVTableValueOpnd(instr, VTableValue::VtableJavascriptRegExp);

    InsertCompareBranch(IR::IndirOpnd::New(src1Opnd, 0, TyMachPtr, instr->m_func),
        vtableOpnd, Js::OpCode::BrNeq_A, helperLabel, instr);

    InsertMove(instr->GetDst(), src1Opnd, instr);
    InsertBranch(Js::OpCode::Br, doneLabel, instr);
    instr->InsertBefore(helperLabel);
    instr->InsertAfter(doneLabel);

    this->LoadScriptContext(instr);
    this->m_lowererMD.LoadHelperArgument(instr, IR::AddrOpnd::NewNull(instr->m_func));   // option
    this->m_lowererMD.LoadHelperArgument(instr, src1Opnd); // regex
    this->m_lowererMD.ChangeToHelperCall(instr, IR::HelperOp_CoerseRegex);
}